

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_template(mg_connection *conn,char *s,mg_expansion *expansions)

{
  char *__s;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *kw;
  int inside_marker;
  int pos;
  int j;
  int i;
  mg_expansion *expansions_local;
  char *s_local;
  mg_connection *conn_local;
  
  kw._4_4_ = 0;
  bVar1 = false;
  pos = 0;
  do {
    if (s[pos] == '\0') {
      if (kw._4_4_ < pos) {
        mg_send_data(conn,s + kw._4_4_,pos - kw._4_4_);
      }
      return;
    }
    if ((!bVar1) && (*(short *)(s + pos) == 0x7b7b)) {
      if (kw._4_4_ < pos) {
        mg_send_data(conn,s + kw._4_4_,pos - kw._4_4_);
      }
      kw._4_4_ = pos;
      bVar1 = true;
    }
    if ((bVar1) && (*(short *)(s + pos) == 0x7d7d)) {
      inside_marker = 0;
      while (expansions[inside_marker].keyword != (char *)0x0) {
        __s = expansions[inside_marker].keyword;
        sVar3 = strlen(__s);
        if ((int)sVar3 == pos - (kw._4_4_ + 2)) {
          iVar2 = memcmp(__s,s + (kw._4_4_ + 2),(long)(pos - (kw._4_4_ + 2)));
          if (iVar2 == 0) {
            (*expansions[inside_marker].handler)(conn);
            kw._4_4_ = pos + 2;
            break;
          }
        }
        inside_marker = inside_marker + 1;
      }
      bVar1 = false;
    }
    pos = pos + 1;
  } while( true );
}

Assistant:

void mg_template(struct mg_connection *conn, const char *s,
                 struct mg_expansion *expansions) {
  int i, j, pos = 0, inside_marker = 0;

  for (i = 0; s[i] != '\0'; i++) {
    if (inside_marker == 0 && !memcmp(&s[i], "{{", 2)) {
      if (i > pos) {
        mg_send_data(conn, &s[pos], i - pos);
      }
      pos = i;
      inside_marker = 1;
    }
    if (inside_marker == 1 && !memcmp(&s[i], "}}", 2)) {
      for (j = 0; expansions[j].keyword != NULL; j++) {
        const char *kw = expansions[j].keyword;
        if ((int) strlen(kw) == i - (pos + 2) &&
            memcmp(kw, &s[pos + 2], i - (pos + 2)) == 0) {
          expansions[j].handler(conn);
          pos = i + 2;
          break;
        }
      }
      inside_marker = 0;
    }
  }
  if (i > pos) {
    mg_send_data(conn, &s[pos], i - pos);
  }
}